

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O0

void __thiscall brown::MySimulator::moveLinear(MySimulator *this,int dx,int dy,bool isDown)

{
  int iVar1;
  _Map_pointer pplVar2;
  _Map_pointer pplVar3;
  size_type sVar4;
  reference pvVar5;
  bool bVar6;
  _Map_pointer *local_168;
  _Map_pointer *local_160;
  float local_154;
  int *local_150;
  float local_144;
  int local_140;
  int local_13c;
  value_type local_130;
  int64_t vt;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *vts;
  int64_t *t;
  bool isx;
  int *piStack_110;
  int dstep;
  int *s;
  bool ismain;
  undefined1 local_f8 [8];
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt2s;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt1s;
  int64_t t2;
  int64_t t1;
  int64_t startTick;
  int local_38;
  int s2;
  int s1;
  float tg;
  int d2step;
  int d1step;
  int iStack_20;
  bool d2is0;
  int d2px;
  int d1px;
  bool isxmain;
  bool diry;
  bool dirx;
  bool isDown_local;
  int dy_local;
  int dx_local;
  MySimulator *this_local;
  
  if ((dx != 0) || (dy != 0)) {
    d2px._2_1_ = 0 < dx;
    d2px._1_1_ = 0 < dy;
    _isxmain = dx;
    if (dx < 1) {
      _isxmain = -dx;
    }
    d1px = dy;
    if (dy < 1) {
      d1px = -dy;
    }
    d2px._0_1_ = d1px < _isxmain;
    local_13c = d1px;
    if ((bool)(byte)d2px) {
      local_13c = _isxmain;
    }
    iStack_20 = local_13c;
    local_140 = _isxmain;
    if ((bool)(byte)d2px) {
      local_140 = d1px;
    }
    d1step = local_140;
    bVar6 = local_140 == 0;
    tg = (float)(local_13c * (this->super_Simulator).PULPERPIX);
    s1 = local_140 * (this->super_Simulator).PULPERPIX;
    if (bVar6) {
      local_144 = -1.0;
    }
    else {
      local_144 = (float)(int)tg / (float)s1;
    }
    s2 = (int)local_144;
    local_38 = 0;
    startTick._4_4_ = 0;
    t1 = this->clk;
    t2 = 0;
    d2step._3_1_ = bVar6;
    d2px._3_1_ = isDown;
    _dy_local = this;
    pplVar2 = (_Map_pointer)std::numeric_limits<long>::max();
    vt1s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_finish.
    _M_node = (_Map_pointer)0x0;
    if (bVar6) {
      vt1s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data._M_finish
      ._M_node = pplVar2;
    }
    std::stack<long,std::deque<long,std::allocator<long>>>::
    stack<std::deque<long,std::allocator<long>>,void>
              ((stack<long,std::deque<long,std::allocator<long>>> *)
               &vt2s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                ._M_finish._M_node);
    std::stack<long,std::deque<long,std::allocator<long>>>::
    stack<std::deque<long,std::allocator<long>>,void>
              ((stack<long,std::deque<long,std::allocator<long>>> *)local_f8);
    while (local_38 < (int)tg || startTick._4_4_ < s1) {
      s._3_1_ = t2 <= (long)vt1s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node;
      if ((bool)s._3_1_) {
        local_150 = &local_38;
      }
      else {
        local_150 = (int *)((long)&startTick + 4);
      }
      piStack_110 = local_150;
      if ((bool)s._3_1_) {
        local_154 = tg;
      }
      else {
        local_154 = (float)s1;
      }
      t._4_4_ = local_154;
      t._3_1_ = s._3_1_ == ((byte)d2px & 1);
      if ((bool)s._3_1_) {
        local_160 = (_Map_pointer *)&t2;
      }
      else {
        local_160 = &vt1s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node;
      }
      vts = (stack<long,_std::deque<long,_std::allocator<long>_>_> *)local_160;
      if ((bool)s._3_1_) {
        local_168 = &vt2s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node;
      }
      else {
        local_168 = (_Map_pointer *)local_f8;
      }
      vt = (int64_t)local_168;
      this->clk = t1 + (long)*local_160;
      Simulator::setpin(&this->super_Simulator,this->clk,(bool)t._3_1_,(bool)(~t._3_1_ & 1),
                        (bool)(d2px._2_1_ & 1),(bool)(d2px._1_1_ & 1),(bool)(d2px._3_1_ & 1));
      iVar1 = *piStack_110;
      *piStack_110 = iVar1 + 1;
      if (iVar1 + 1 < (int)t._4_4_) {
        local_130 = 0;
        sVar4 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::size
                          ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)vt);
        if (sVar4 < (ulong)(long)((int)t._4_4_ - *piStack_110)) {
          bVar6 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::empty
                            ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)vt);
          if ((bVar6) ||
             (pvVar5 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::top
                                 ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)vt),
             (long)(this->super_Simulator).MINT < *pvVar5)) {
            local_130 = linearSpeedCurve(this,(int64_t)(vts->c).
                                                  super__Deque_base<long,_std::allocator<long>_>.
                                                  _M_impl.super__Deque_impl_data._M_map);
            if (local_130 < (this->super_Simulator).MINT) {
              local_130 = (value_type)(this->super_Simulator).MINT;
            }
            std::stack<long,_std::deque<long,_std::allocator<long>_>_>::push
                      ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)vt,&local_130);
          }
          else {
            local_130 = (value_type)(this->super_Simulator).MINT;
          }
        }
        else {
          pvVar5 = std::stack<long,_std::deque<long,_std::allocator<long>_>_>::top
                             ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)vt);
          local_130 = *pvVar5;
          std::stack<long,_std::deque<long,_std::allocator<long>_>_>::pop
                    ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)vt);
        }
        if ((s._3_1_ & 1) == 0) {
          local_130 = (value_type)((float)local_130 * (float)s2);
        }
        (vts->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
        _M_map = (_Map_pointer)
                 (local_130 +
                 (long)(vts->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                       super__Deque_impl_data._M_map);
      }
      else {
        pplVar3 = (_Map_pointer)std::numeric_limits<long>::max();
        (vts->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data.
        _M_map = pplVar3;
      }
    }
    this->clk = this->clk + (long)(this->super_Simulator).MAXT;
    Simulator::setpin(&this->super_Simulator,this->clk,false,false,(bool)(d2px._2_1_ & 1),
                      (bool)(d2px._1_1_ & 1),(bool)(d2px._3_1_ & 1));
    std::stack<long,_std::deque<long,_std::allocator<long>_>_>::~stack
              ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)local_f8);
    std::stack<long,_std::deque<long,_std::allocator<long>_>_>::~stack
              ((stack<long,_std::deque<long,_std::allocator<long>_>_> *)
               &vt2s.c.super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
                ._M_finish._M_node);
  }
  return;
}

Assistant:

void MySimulator::moveLinear(int dx, int dy, bool isDown) {
    if (dx == 0 && dy == 0) {
        return;
    }

    // direction and displacement
    bool dirx = (dx > 0);
    bool diry = (dy > 0);
    dx = std::abs(dx);
    dy = std::abs(dy);

    // determine primary/long and secondary/short axis
    bool isxmain = (dx > dy);
    int d1px = (isxmain ? dx : dy);
    int d2px = (isxmain ? dy : dx);
    bool d2is0 = (d2px == 0);

    // target steps and ratio
    int d1step = d1px * PULPERPIX;
    int d2step = d2px * PULPERPIX;
    float tg = d2is0? -1 : static_cast<float>(d1step)/d2step;

    // step keeping
    int s1 = 0;
    int s2 = 0;

    // time keeping
    std::int64_t startTick = clk;
    std::int64_t t1 = 0;
    std::int64_t t2 = d2is0 ? std::numeric_limits<std::int64_t>::max() : 0;

    // speed history
    std::stack<std::int64_t> vt1s;
    std::stack<std::int64_t> vt2s;

    while ((s1 < d1step) || (s2 < d2step)) {
        // determine driving axis
        bool ismain = (t1 <= t2);
        int& s = ismain ? s1 : s2;
        int dstep = ismain ? d1step : d2step;
        bool isx = (ismain == isxmain);
        std::int64_t& t = ismain ? t1 : t2;
        std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;

        // step
        clk = startTick + t;
        setpin(clk, isx, !isx, dirx, diry, isDown);
        if (++s >= dstep) {
            t = std::numeric_limits<std::int64_t>::max();
            continue;
        }

        // set next step interval
        std::int64_t vt = 0;
        if (vts.size() >= (dstep - s)) { // decelerate
            vt = vts.top();
            vts.pop();
        } else if (vts.empty() || (vts.top() > MINT)) { // accelerate
            vt = linearSpeedCurve(t);
            if (vt < MINT) { // speeding
                vt = MINT;
            }
            vts.push(vt);
        } else { // hold
            vt = MINT;
        }

        // adjust speed on secondary axis
        if (!ismain) {
            vt *= tg;
        }
        t += vt;
    }

    // delay, a time gap between line drawings
    clk += MAXT;
    setpin(clk, false, false, dirx, diry, isDown);
}